

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O3

void nfa_closure(DFAState *x)

{
  NFAState **ppNVar1;
  NFAState *pNVar2;
  uint uVar3;
  ulong uVar4;
  NFAState *pNVar5;
  ulong uVar6;
  size_t __nmemb;
  NFAState **__base;
  ulong uVar7;
  ulong uVar8;
  
  uVar3 = (x->states).n;
  if (uVar3 == 0) {
    __base = (x->states).v;
    if (__base == (NFAState **)0x0) {
      return;
    }
    __nmemb = 0;
  }
  else {
    ppNVar1 = (x->states).e;
    __base = (x->states).v;
    uVar8 = 0;
    do {
      pNVar2 = __base[uVar8];
      if ((pNVar2->epsilon).n != 0) {
        uVar7 = 0;
        pNVar5 = pNVar2;
        do {
          uVar3 = (x->states).n;
          uVar4 = (ulong)uVar3;
          if (uVar4 == 0) {
            if (__base != ppNVar1) goto LAB_0013f2cf;
LAB_0013f2ea:
            pNVar5 = (pNVar2->epsilon).v[uVar7];
LAB_0013f2fa:
            (x->states).n = uVar3 + 1;
            __base[uVar4] = pNVar5;
          }
          else {
            uVar6 = 0;
            do {
              if ((pNVar5->epsilon).v[uVar7] == __base[uVar6]) goto LAB_0013f300;
              uVar6 = uVar6 + 1;
            } while (uVar4 != uVar6);
            if (__base == ppNVar1) {
              if (uVar3 < 3) goto LAB_0013f2ea;
            }
            else if ((uVar3 & 7) != 0) {
              pNVar5 = (pNVar2->epsilon).v[uVar7];
              goto LAB_0013f2fa;
            }
LAB_0013f2cf:
            vec_add_internal(x,(pNVar2->epsilon).v[uVar7]);
          }
LAB_0013f300:
          uVar7 = uVar7 + 1;
          __base = (x->states).v;
          pNVar5 = __base[uVar8];
        } while (uVar7 < (pNVar5->epsilon).n);
        uVar3 = (x->states).n;
      }
      uVar8 = uVar8 + 1;
      __nmemb = (size_t)uVar3;
    } while (uVar8 < __nmemb);
  }
  qsort(__base,__nmemb,8,nfacmp);
  return;
}

Assistant:

static void nfa_closure(DFAState *x) {
  uint i, j, k;

  for (i = 0; i < x->states.n; i++) {
    NFAState *s = x->states.v[i];
    for (j = 0; j < x->states.v[i]->epsilon.n; j++) {
      for (k = 0; k < x->states.n; k++)
        if (x->states.v[i]->epsilon.v[j] == x->states.v[k]) goto Lbreak;
      vec_add(&x->states, s->epsilon.v[j]);
    Lbreak:;
    }
  }
  if (x->states.v != NULL) qsort(x->states.v, x->states.n, sizeof(x->states.v[0]), nfacmp);
}